

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O0

void processFile(MidiFile *midifile,Options *options)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  MidiEventList *pMVar5;
  int local_224;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  undefined1 local_e0 [8];
  string temperament;
  string local_b8;
  int local_98;
  allocator local_91;
  int base;
  int local_70;
  int instrumentCode;
  allocator local_59;
  string local_58;
  int local_38;
  int local_34;
  int newchan;
  int pc;
  int pitch;
  int chan;
  MidiEvent *curNote;
  Options *pOStack_18;
  int e;
  Options *options_local;
  MidiFile *midifile_local;
  
  pOStack_18 = options;
  options_local = (Options *)midifile;
  smf::MidiFile::joinTracks(midifile);
  curNote._4_4_ = 0;
  while( true ) {
    iVar4 = curNote._4_4_;
    pMVar5 = smf::MidiFile::operator[]((MidiFile *)options_local,0);
    iVar3 = smf::MidiEventList::getEventCount(pMVar5);
    pOVar1 = pOStack_18;
    if (iVar3 <= iVar4) break;
    pMVar5 = smf::MidiFile::operator[]((MidiFile *)options_local,0);
    _pitch = smf::MidiEventList::operator[](pMVar5,curNote._4_4_);
    bVar2 = smf::MidiMessage::isPatchChange(&_pitch->super_MidiMessage);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_pitch);
    }
    bVar2 = smf::MidiMessage::isNote(&_pitch->super_MidiMessage);
    if ((bVar2) && (pc = smf::MidiMessage::getChannel(&_pitch->super_MidiMessage), pc != 9)) {
      newchan = smf::MidiMessage::getKeyNumber(&_pitch->super_MidiMessage);
      local_34 = newchan % 0xc;
      local_224 = local_34;
      if (8 < local_34) {
        local_224 = local_34 + 1;
      }
      local_38 = local_224;
      smf::MidiMessage::setChannel(&_pitch->super_MidiMessage,local_224);
    }
    curNote._4_4_ = curNote._4_4_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"type-0",&local_59);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    smf::MidiFile::splitTracks((MidiFile *)options_local);
  }
  removeInstruments((MidiFile *)options_local);
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&base,"instrument",&local_91);
  iVar4 = smf::Options::getInteger(pOVar1,(string *)&base);
  std::__cxx11::string::~string((string *)&base);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = iVar4;
  applyInstrument((MidiFile *)options_local,iVar4);
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"base-pitch-class",
             (allocator *)(temperament.field_2._M_local_buf + 0xf));
  iVar4 = smf::Options::getInteger(pOVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(temperament.field_2._M_local_buf + 0xf));
  pOVar1 = pOStack_18;
  if (iVar4 < 0) {
    local_98 = 0;
  }
  else {
    local_98 = iVar4;
    if (0xb < iVar4) {
      local_98 = iVar4 % 0xc;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"temperament",&local_101);
  smf::Options::getString((string *)local_e0,pOVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"pythagorean",&local_129);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"pythagorean");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"meantone",&local_151);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"meantone");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"kirnberger3",&local_179);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"kirnberger3");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"valotti",&local_1a1);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"valotti");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"bad",&local_1c9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"bad");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"weird",&local_1f1);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"weird");
  }
  pOVar1 = pOStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"equal",&local_219);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_e0,"equal");
  }
  applyTemperament((MidiFile *)options_local,(string *)local_e0,local_98);
  smf::MidiFile::sortTracks((MidiFile *)options_local);
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void processFile(MidiFile& midifile, Options& options) {
	midifile.joinTracks();
	for (int e=0; e<midifile[0].getEventCount(); e++) {
		MidiEvent *curNote = &midifile[0][e];
		if (curNote->isPatchChange()) {
			curNote->clear();
		}
		if (!curNote->isNote()) {
			continue;
		}
		int chan = curNote->getChannel();
		if (chan == 0x09) {
			// ignore drum track
			continue;
		}
		int pitch = curNote->getKeyNumber();
		int pc = pitch % 12;
		int newchan = (pc < 0x09) ? pc : pc + 1;
		curNote->setChannel(newchan);
	}

	if (!options.getBoolean("type-0")) {
		midifile.splitTracks();
	}

	removeInstruments(midifile);
	int instrumentCode = options.getInteger("instrument");
	applyInstrument(midifile, instrumentCode);

	int base = options.getInteger("base-pitch-class");
	if (base < 0) {
		base = 0;
	} else if (base > 11) {
		base = base % 12;
	}
	string temperament = options.getString("temperament");
	if (options.getBoolean("pythagorean")) {
		temperament = "pythagorean";
	}
	if (options.getBoolean("meantone")) {
		temperament = "meantone";
	}
	if (options.getBoolean("kirnberger3")) {
		temperament = "kirnberger3";
	}
	if (options.getBoolean("valotti")) {
		temperament = "valotti";
	}
	if (options.getBoolean("bad")) {
		temperament = "bad";
	}
	if (options.getBoolean("weird")) {
		temperament = "weird";
	}
	if (options.getBoolean("equal")) {
		temperament = "equal";
	}
	applyTemperament(midifile, temperament, base);

	midifile.sortTracks();
}